

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosidemix.hpp
# Opt level: O0

void __thiscall
TwoSideMix::TwoSideMix(TwoSideMix *this,Json *conf,BSDF *componentA,BSDF *componentB)

{
  undefined8 *puVar1;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  vec3f vVar2;
  Json *unaff_retaddr;
  vec3f vamount;
  Json *in_stack_00000258;
  BSDF *in_stack_00000260;
  float local_38;
  float local_2c;
  float fStack_28;
  
  BSDF::BSDF(in_stack_00000260,in_stack_00000258);
  *in_RDI = &PTR_f_001e8c78;
  in_RDI[5] = in_RDX;
  in_RDI[6] = in_RCX;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)this,(char *)conf);
  vVar2 = json2vec3f(unaff_retaddr);
  local_38 = vVar2.z;
  local_2c = vVar2.x;
  fStack_28 = vVar2.y;
  if (local_2c == fStack_28) {
    if ((local_2c == local_38) && (!NAN(local_2c) && !NAN(local_38))) {
      *(float *)(in_RDI + 7) = local_2c;
      if ((in_RDX != 0) && (in_RCX != 0)) {
        if ((0.0 <= *(float *)(in_RDI + 7)) && (*(float *)(in_RDI + 7) <= 1.0)) {
          return;
        }
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = "mix: invalid amount";
        __cxa_throw(puVar1,&char_const*::typeinfo,0);
      }
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "mix: invalid components";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "mix: invalid amount";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

TwoSideMix(const Json& conf, BSDF const* componentA, BSDF const* componentB):
		BSDF(conf), componentA(componentA), componentB(componentB)
	{
		vec3f vamount = json2vec3f(conf["amount"]);
		if (vamount.x != vamount.y || vamount.x != vamount.z) throw "mix: invalid amount";
		amount = vamount.x;
		if (componentA == NULL || componentB == NULL) throw "mix: invalid components";
		if (!(amount>=0 && amount<=1)) throw "mix: invalid amount";
	}